

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_59::InMemoryDirectory::replaceFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  ArrayDisposer **ppAVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  AtomicRefcounted *refcounted;
  _func_int **pp_Var5;
  undefined4 in_register_0000000c;
  long lVar6;
  undefined8 *puVar7;
  Replacer<kj::File> *extraout_RDX;
  char *pcVar8;
  Replacer<kj::File> *extraout_RDX_00;
  Replacer<kj::File> *extraout_RDX_01;
  Replacer<kj::File> *pRVar9;
  undefined4 in_R8D;
  _func_int *p_Var10;
  File *ptrCopy;
  StringPtr name;
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar11;
  Fault f;
  undefined1 local_58 [32];
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  
  lVar6 = CONCAT44(in_register_0000000c,mode);
  puVar7 = (undefined8 *)path.parts.size_;
  name.content.ptr = path.parts.ptr;
  if (lVar6 == 1) {
    puVar2 = (undefined8 *)name.content.ptr[2].content.size_;
    (**(code **)*puVar2)(local_58,puVar2,name.content.ptr[2].content.ptr);
    pcVar8 = (char *)*puVar7;
    lVar6 = puVar7[1];
    pp_Var5 = (_func_int **)operator_new(0x48);
    if (lVar6 == 0) {
      pcVar8 = "";
    }
    local_58._24_8_ = local_58._0_8_;
    local_38.ptr = (Waiter *)local_58._8_8_;
    local_58._8_8_ = (_func_int **)0x0;
    *(undefined4 *)(pp_Var5 + 1) = in_R8D;
    *pp_Var5 = (_func_int *)&PTR_get_00281198;
    *(undefined1 *)((long)pp_Var5 + 0xc) = 0;
    LOCK();
    ppAVar1 = &((name.content.ptr)->content).disposer;
    *(int *)ppAVar1 = *(int *)ppAVar1 + 1;
    UNLOCK();
    pp_Var5[2] = (_func_int *)&((name.content.ptr)->content).size_;
    pp_Var5[3] = (_func_int *)name.content.ptr;
    heapString((String *)(pp_Var5 + 4),pcVar8,lVar6 + -1 + (ulong)(lVar6 == 0));
    uVar4 = local_58._8_8_;
    pp_Var5[7] = (_func_int *)local_58._24_8_;
    pp_Var5[8] = (_func_int *)local_38.ptr;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>>
          ::instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var5;
    pRVar9 = extraout_RDX;
    if ((_func_int **)local_58._8_8_ == (_func_int **)0x0) goto LAB_001efd46;
    local_58._8_8_ = (_func_int **)0x0;
    p_Var10 = (_func_int *)(uVar4 + *(long *)(*(_func_int **)uVar4 + -0x10));
    pcVar8 = (((String *)local_58._0_8_)->content).ptr;
LAB_001efcfe:
    (**(code **)pcVar8)(local_58._0_8_,p_Var10);
    pRVar9 = extraout_RDX_00;
  }
  else {
    if (lVar6 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x48b,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)local_58);
    }
    else {
      lVar3 = puVar7[1];
      if (lVar3 == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*puVar7;
      }
      name.content.size_ = (size_t)pcVar8;
      tryGetParent((InMemoryDirectory *)local_58,name,(int)lVar3 + (uint)(lVar3 == 0));
      uVar4 = local_58._8_8_;
      if ((_func_int **)local_58._8_8_ != (_func_int **)0x0) {
        (**(code **)(*(_func_int **)local_58._8_8_ + 0x70))
                  (this,local_58._8_8_,puVar7 + 3,lVar6 + -1,in_R8D);
        p_Var10 = (_func_int *)(uVar4 + *(long *)(*(_func_int **)uVar4 + -0x10));
        pcVar8 = (((String *)local_58._0_8_)->content).ptr;
        goto LAB_001efcfe;
      }
    }
    puVar7 = (undefined8 *)name.content.ptr[2].content.size_;
    (**(code **)*puVar7)(local_58,puVar7,name.content.ptr[2].content.ptr);
    pp_Var5 = (_func_int **)operator_new(0x20);
    *(undefined4 *)(pp_Var5 + 1) = 3;
    *pp_Var5 = (_func_int *)&PTR_get_00281208;
    pp_Var5[2] = (_func_int *)local_58._0_8_;
    pp_Var5[3] = (_func_int *)local_58._8_8_;
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::(anonymous_namespace)::InMemoryDirectory::BrokenReplacer<kj::File>>::
          instance;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var5;
    pRVar9 = extraout_RDX_01;
  }
LAB_001efd46:
  OVar11.ptr = pRVar9;
  OVar11.disposer = (Disposer *)this;
  return OVar11;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("can't replace self") { break; }
    } else if (path.size() == 1) {
      // don't need lock just to construct a file
      return heap<ReplacerImpl<File>>(*this, path[0],
          impl.getWithoutLock().newFile(), mode);
    } else {
      KJ_IF_SOME(child, tryGetParent(path[0], mode)) {
        return child->replaceFile(path.slice(1, path.size()), mode);
      }
    }
    return heap<BrokenReplacer<File>>(impl.getWithoutLock().newFile());
  }